

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplify.cc
# Opt level: O1

bool duckdb_re2::ChildArgsChanged(Regexp *re,Regexp **child_args)

{
  ulong uVar1;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  
  uVar4 = (ulong)re->nsub_;
  bVar5 = uVar4 != 0;
  if (bVar5) {
    if (uVar4 == 1) {
      paVar2 = &re->field_5;
    }
    else {
      paVar2 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(re->field_5).submany_;
    }
    if (*child_args == (Regexp *)paVar2->submany_) {
      uVar1 = 1;
      do {
        uVar3 = uVar1;
        if (uVar4 == uVar3) {
          bVar5 = uVar3 < uVar4;
          goto LAB_0049aabb;
        }
        uVar1 = uVar3 + 1;
      } while (child_args[uVar3] == (Regexp *)paVar2[uVar3].submany_);
      bVar5 = uVar3 < uVar4;
    }
    if (bVar5 != false) {
      return bVar5;
    }
  }
LAB_0049aabb:
  if (re->nsub_ != 0) {
    uVar4 = 0;
    do {
      Regexp::Decref(child_args[uVar4]);
      uVar4 = uVar4 + 1;
    } while (uVar4 < re->nsub_);
  }
  return bVar5;
}

Assistant:

static bool ChildArgsChanged(Regexp* re, Regexp** child_args) {
  for (int i = 0; i < re->nsub(); i++) {
    Regexp* sub = re->sub()[i];
    Regexp* newsub = child_args[i];
    if (newsub != sub)
      return true;
  }
  for (int i = 0; i < re->nsub(); i++) {
    Regexp* newsub = child_args[i];
    newsub->Decref();
  }
  return false;
}